

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZEqnArray<double>_>::TPZVec
          (TPZVec<TPZEqnArray<double>_> *this,initializer_list<TPZEqnArray<double>_> *list)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  size_type sVar4;
  TPZEqnArray<double> *this_00;
  ulong uVar5;
  iterator pTVar6;
  long lVar7;
  TPZEqnArray<double> *this_01;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_017c3898;
  this->fStore = (TPZEqnArray<double> *)0x0;
  uVar1 = list->_M_len;
  if (uVar1 == 0) {
    this_00 = (TPZEqnArray<double> *)0x0;
    sVar4 = 0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x3290),8) == 0) {
      uVar5 = SUB168(auVar2 * ZEXT816(0x3290),0) | 8;
    }
    puVar3 = (ulong *)operator_new__(uVar5);
    *puVar3 = uVar1;
    this_00 = (TPZEqnArray<double> *)(puVar3 + 1);
    lVar7 = 0;
    this_01 = this_00;
    do {
      TPZEqnArray<double>::TPZEqnArray(this_01);
      lVar7 = lVar7 + -0x3290;
      this_01 = this_01 + 1;
    } while (uVar1 * -0x3290 - lVar7 != 0);
    this->fStore = this_00;
    sVar4 = list->_M_len;
  }
  pTVar6 = list->_M_array;
  for (lVar7 = sVar4 * 0x3290; lVar7 != 0; lVar7 = lVar7 + -0x3290) {
    TPZEqnArray<double>::operator=(this_00,pTVar6);
    pTVar6 = pTVar6 + 1;
    this_00 = this_00 + 1;
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}